

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O1

Expression *
slang::ast::Expression::bindLValue
          (ExpressionSyntax *lhs,Type *rhs,SourceLocation location,ASTContext *context,bool isInout)

{
  Compilation *compilation;
  ulong uVar1;
  Expression *pEVar2;
  InstanceSymbolBase *pIVar3;
  Expression *pEVar4;
  bitmask<slang::ast::AssignFlags> flags;
  SourceRange opRange;
  undefined1 local_68 [16];
  bitmask<slang::ast::ASTFlags> local_58;
  SourceLocation SStack_50;
  SourceLocation local_48;
  ConversionKind local_40;
  
  compilation = ((context->scope).ptr)->compilation;
  local_68._0_8_ = location;
  local_68._8_8_ = location;
  pEVar2 = &BumpAllocator::
            emplace<slang::ast::EmptyArgumentExpression,slang::ast::Type_const&,slang::SourceRange>
                      (&compilation->super_BumpAllocator,rhs,(SourceRange *)local_68)->
            super_Expression;
  pIVar3 = ASTContext::getInstance(context);
  if (((lhs->super_SyntaxNode).kind != StreamingConcatenationExpression || isInout) ||
     ((pIVar3 != (InstanceSymbolBase *)0x0 && ((pIVar3->arrayPath)._M_extent._M_extent_value != 0)))
     ) {
    pEVar4 = create(compilation,lhs,context,
                    (bitmask<slang::ast::ASTFlags>)((ulong)isInout << 0x26 | 0x100000),
                    (pEVar2->type).ptr);
    local_68._8_8_ = (pEVar4->type).ptr;
    local_58.m_bits = 0;
    SStack_50 = (SourceLocation)0x0;
    local_48 = (SourceLocation)0x0;
    local_40 = Propagated;
    local_68._0_8_ = context;
    pEVar4 = visitExpression<slang::ast::Expression,slang::ast::Expression::PropagationVisitor&>
                       (pEVar4,pEVar4,(PropagationVisitor *)local_68);
  }
  else {
    pEVar4 = selfDetermined(compilation,lhs,context,(bitmask<slang::ast::ASTFlags>)0x100080);
  }
  if (pIVar3 != (InstanceSymbolBase *)0x0 && !isInout) {
    flags.m_bits = ((pIVar3->super_Symbol).kind != PrimitiveInstance) << 3;
  }
  else {
    flags.m_bits = (pIVar3 != (InstanceSymbolBase *)0x0) << 4;
  }
  uVar1 = (context->flags).m_bits;
  opRange = slang::syntax::SyntaxNode::sourceRange(&lhs->super_SyntaxNode);
  ASTContext::resetFlags
            ((ASTContext *)local_68,context,
             (bitmask<slang::ast::ASTFlags>)(uVar1 & 0x100000000 | 0x10000000));
  pEVar2 = AssignmentExpression::fromComponents
                     (compilation,(optional<slang::ast::BinaryOperator>)0x0,flags,pEVar4,pEVar2,
                      opRange,(TimingControl *)0x0,opRange,(ASTContext *)local_68);
  return pEVar2;
}

Assistant:

const Expression& Expression::bindLValue(const ExpressionSyntax& lhs, const Type& rhs,
                                         SourceLocation location, const ASTContext& context,
                                         bool isInout) {
    Compilation& comp = context.getCompilation();

    // Create a placeholder expression that will carry the type of the rhs.
    // Nothing will ever actually look at this expression, it's there only
    // to fill the space in the created AssignmentExpression.
    auto rhsExpr = comp.emplace<EmptyArgumentExpression>(rhs, SourceRange{location, location});

    auto instance = context.getInstance();
    Expression* lhsExpr;
    if (lhs.kind == SyntaxKind::StreamingConcatenationExpression && !isInout &&
        (!instance || instance->arrayPath.empty())) {
        lhsExpr = &selfDetermined(comp, lhs, context,
                                  ASTFlags::StreamingAllowed | ASTFlags::LValue);
    }
    else {
        bitmask<ASTFlags> astFlags = ASTFlags::LValue;
        if (isInout)
            astFlags |= ASTFlags::LAndRValue;

        lhsExpr = &create(comp, lhs, context, astFlags, rhsExpr->type);
        selfDetermined(context, lhsExpr);
    }

    bitmask<AssignFlags> assignFlags;
    if (instance) {
        if (isInout)
            assignFlags = AssignFlags::InOutPort;
        else if (instance->kind != SymbolKind::PrimitiveInstance)
            assignFlags = AssignFlags::OutputPort;
    }

    bitmask<ASTFlags> astFlags = ASTFlags::OutputArg;
    if (context.flags.has(ASTFlags::NotADriver))
        astFlags |= ASTFlags::NotADriver;

    SourceRange lhsRange = lhs.sourceRange();
    return AssignmentExpression::fromComponents(comp, std::nullopt, assignFlags, *lhsExpr, *rhsExpr,
                                                lhsRange, /* timingControl */ nullptr, lhsRange,
                                                context.resetFlags(astFlags));
}